

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  int iVar1;
  CRef r;
  bool bVar2;
  Size SVar3;
  Lit p_00;
  int iVar4;
  Lit *pLVar5;
  vec<Minisat::Solver::Watcher,_int> *this_00;
  Clause *this_01;
  Lit *pLVar6;
  vec<Minisat::Solver::Watcher,_int> *this_02;
  bool local_d9;
  lbool local_a9;
  int local_a8;
  Lit local_a4;
  uint8_t local_9d;
  int local_9c;
  lbool local_95;
  int local_94;
  uint8_t local_8d;
  int k;
  lbool local_85;
  int local_84;
  int local_80;
  Watcher local_7c;
  Watcher w;
  Lit first;
  Lit false_lit;
  Clause *c;
  CRef cr;
  lbool local_45;
  Lit local_44;
  Watcher *pWStack_40;
  Lit blocker;
  Watcher *end;
  Watcher *j;
  Watcher *i;
  vec<Minisat::Solver::Watcher,_int> *ws;
  int local_18;
  Lit p;
  int num_props;
  CRef confl;
  Solver *this_local;
  
  p.x = -1;
  local_18 = 0;
  do {
    iVar1 = this->qhead;
    SVar3 = vec<Minisat::Lit,_int>::size(&this->trail);
    if (SVar3 <= iVar1) {
      this->propagations = (long)local_18 + this->propagations;
      this->simpDB_props = this->simpDB_props - (long)local_18;
      return p.x;
    }
    iVar1 = this->qhead;
    this->qhead = iVar1 + 1;
    pLVar5 = vec<Minisat::Lit,_int>::operator[](&this->trail,iVar1);
    ws._4_4_ = pLVar5->x;
    this_00 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
              ::lookup(&this->watches,(Lit *)((long)&ws + 4));
    local_18 = local_18 + 1;
    end = vec::operator_cast_to_Watcher_((vec *)this_00);
    SVar3 = vec<Minisat::Solver::Watcher,_int>::size(this_00);
    pWStack_40 = end + SVar3;
    j = end;
LAB_0010da83:
    if (j != pWStack_40) {
      local_44.x = (j->blocker).x;
      local_45 = value(this,local_44);
      bVar2 = lbool::operator==(&local_45,l_True);
      if (bVar2) {
        *end = *j;
        end = end + 1;
        j = j + 1;
      }
      else {
        r = j->cref;
        this_01 = ClauseAllocator::operator[](&this->ca,r);
        p_00 = operator~(ws._4_4_);
        pLVar5 = Clause::operator[](this_01,0);
        bVar2 = Lit::operator==(pLVar5,p_00);
        if (bVar2) {
          pLVar5 = Clause::operator[](this_01,1);
          pLVar6 = Clause::operator[](this_01,0);
          pLVar6->x = pLVar5->x;
          pLVar5 = Clause::operator[](this_01,1);
          pLVar5->x = p_00.x;
        }
        pLVar5 = Clause::operator[](this_01,1);
        w.blocker = p_00;
        bVar2 = Lit::operator==(pLVar5,p_00);
        if (!bVar2) {
          __assert_fail("c[1] == false_lit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                        ,0x211,"CRef Minisat::Solver::propagate()");
        }
        j = j + 1;
        pLVar5 = Clause::operator[](this_01,0);
        local_80 = pLVar5->x;
        w.cref = local_80;
        Watcher::Watcher(&local_7c,r,(Lit)local_80);
        local_84 = local_44.x;
        bVar2 = Lit::operator!=((Lit *)&w,local_44);
        local_d9 = false;
        if (bVar2) {
          k = w.cref;
          local_85 = value(this,(Lit)w.cref);
          local_8d = l_True.value;
          local_d9 = lbool::operator==(&local_85,l_True);
        }
        if (local_d9 == false) {
          for (local_94 = 2; iVar1 = local_94, iVar4 = Clause::size(this_01), iVar1 < iVar4;
              local_94 = local_94 + 1) {
            pLVar5 = Clause::operator[](this_01,local_94);
            local_9c = pLVar5->x;
            local_95 = value(this,(Lit)local_9c);
            local_9d = l_False.value;
            bVar2 = lbool::operator!=(&local_95,l_False);
            if (bVar2) {
              pLVar5 = Clause::operator[](this_01,local_94);
              pLVar6 = Clause::operator[](this_01,1);
              pLVar6->x = pLVar5->x;
              pLVar5 = Clause::operator[](this_01,local_94);
              pLVar5->x = p_00.x;
              pLVar5 = Clause::operator[](this_01,1);
              local_a8 = pLVar5->x;
              local_a4 = operator~(local_a8);
              this_02 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                        ::operator[](&this->watches,&local_a4);
              vec<Minisat::Solver::Watcher,_int>::push(this_02,&local_7c);
              goto LAB_0010da83;
            }
          }
          *end = local_7c;
          local_a9 = value(this,(Lit)w.cref);
          bVar2 = lbool::operator==(&local_a9,l_False);
          if (bVar2) {
            p.x = r;
            SVar3 = vec<Minisat::Lit,_int>::size(&this->trail);
            this->qhead = SVar3;
            end = end + 1;
            while (j < pWStack_40) {
              *end = *j;
              end = end + 1;
              j = j + 1;
            }
          }
          else {
            uncheckedEnqueue(this,(Lit)w.cref,r);
            end = end + 1;
          }
        }
        else {
          *end = local_7c;
          end = end + 1;
        }
      }
      goto LAB_0010da83;
    }
    vec<Minisat::Solver::Watcher,_int>::shrink(this_00,(Size)((long)j - (long)end >> 3));
  } while( true );
}

Assistant:

CRef Solver::propagate()
{
    CRef    confl     = CRef_Undef;
    int     num_props = 0;

    while (qhead < trail.size()){
        Lit            p   = trail[qhead++];     // 'p' is enqueued fact to propagate.
        vec<Watcher>&  ws  = watches.lookup(p);
        Watcher        *i, *j, *end;
        num_props++;

        for (i = j = (Watcher*)ws, end = i + ws.size();  i != end;){
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if (value(blocker) == l_True){
                *j++ = *i++; continue; }

            // Make sure the false literal is data[1]:
            CRef     cr        = i->cref;
            Clause&  c         = ca[cr];
            Lit      false_lit = ~p;
            if (c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit     first = c[0];
            Watcher w     = Watcher(cr, first);
            if (first != blocker && value(first) == l_True){
                *j++ = w; continue; }

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False){
                    c[1] = c[k]; c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause; }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False){
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end)
                    *j++ = *i++;
            }else
                uncheckedEnqueue(first, cr);

        NextClause:;
        }
        ws.shrink(i - j);
    }
    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}